

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

void __thiscall despot::EvalLog::SetInitialBudget(EvalLog *this,string *instance)

{
  pointer piVar1;
  pointer pcVar2;
  double dVar3;
  int iVar4;
  ostream *this_00;
  long *plVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  string local_90;
  string local_70;
  string local_50;
  
  curr_inst_budget = 0.0;
  piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  lVar6 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar7 = 0;
    do {
      uVar8 = uVar8 + piVar1[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    uVar8 = (uint)(uVar8 == 0x960);
  }
  if ((char)uVar8 == '\0') {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (instance->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + instance->_M_string_length);
    iVar4 = GetNumRemainingRuns(this,&local_50);
    bVar10 = iVar4 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar10 = false;
  }
  if (bVar10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Num of remaining runs: curr / total = ",0x26);
    pcVar2 = (instance->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + instance->_M_string_length);
    iVar4 = GetNumRemainingRuns(this,&local_70);
    this_00 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," / ",3);
    piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1;
    if (lVar6 == 0) {
      iVar4 = 0x960;
    }
    else {
      lVar6 = lVar6 >> 2;
      lVar7 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + piVar1[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
      iVar4 = 0x960 - iVar4;
    }
    plVar5 = (long *)std::ostream::operator<<(this_00,iVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    dVar3 = curr_inst_start_time;
    lVar6 = start_time;
    piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1;
    if (lVar7 == 0) {
      dVar11 = 2400.0;
    }
    else {
      lVar7 = lVar7 >> 2;
      lVar9 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + piVar1[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
      dVar11 = (double)(0x960 - iVar4);
    }
    pcVar2 = (instance->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + instance->_M_string_length);
    iVar4 = GetNumRemainingRuns(this,&local_90);
    curr_inst_budget = (double)iVar4 * ((((double)lVar6 - dVar3) + 86400.0) / dVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (curr_inst_budget < 0.0) {
      curr_inst_budget = 0.0;
    }
    if (1080.0 < curr_inst_budget) {
      curr_inst_budget = 1080.0;
    }
  }
  return;
}

Assistant:

void EvalLog::SetInitialBudget(string instance) {
	curr_inst_budget = 0;
	if (GetNumRemainingRuns() != 0 && GetNumRemainingRuns(instance) != 0) {
		cout << "Num of remaining runs: curr / total = "
				<< GetNumRemainingRuns(instance) << " / "
				<< GetNumRemainingRuns() << endl;
		curr_inst_budget = (24 * 3600 - (curr_inst_start_time - start_time))
				/ GetNumRemainingRuns() * GetNumRemainingRuns(instance);
		if (curr_inst_budget < 0)
			curr_inst_budget = 0;
		if (curr_inst_budget > 18 * 60)
			curr_inst_budget = 18 * 60;
	}
}